

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O1

int npf_vpprintf(npf_putc pc,void *pc_ctx,char *format,__va_list_tag *args)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte in_AL;
  uint_fast8_t base;
  int iVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  npf_uint_t *pnVar7;
  undefined1 *puVar8;
  uint *puVar9;
  ushort *puVar10;
  int *piVar11;
  short *psVar12;
  char *pcVar13;
  npf_uint_t nVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  byte *pbVar18;
  byte *pbVar19;
  ulong uVar20;
  byte bVar21;
  long lVar22;
  uint uVar23;
  npf_uint_t val;
  ulong uVar24;
  byte unaff_R14B;
  anon_union_24_2_9e8356ad u;
  char local_7d;
  ulong local_58 [3];
  __va_list_tag *local_40;
  ulong local_38;
  
  iVar4 = 0;
  local_40 = args;
  bVar15 = in_AL;
  bVar3 = in_AL;
LAB_00104ddf:
  bVar21 = *format;
  if (bVar21 == 0x25) {
    bVar3 = 0;
    unaff_R14B = 0;
    pbVar18 = (byte *)format;
LAB_00104e09:
    pbVar18 = pbVar18 + 3;
    do {
      bVar15 = pbVar18[-2];
      if (bVar15 == 0x20) {
        bVar15 = unaff_R14B;
        if (unaff_R14B == 0) {
          bVar15 = 0x20;
        }
      }
      else if (bVar15 != 0x2b) goto LAB_00104e2f;
      pbVar18 = pbVar18 + 1;
      unaff_R14B = bVar15;
    } while( true );
  }
  iVar16 = 0;
  if (bVar21 == 0) {
    return iVar4;
  }
  goto switchD_00104ed2_caseD_65;
LAB_00104e2f:
  if (bVar15 != 0x23) goto LAB_00104e40;
  pbVar18 = pbVar18 + -2;
  bVar3 = 0x23;
  goto LAB_00104e09;
LAB_00104e40:
  uVar23 = (int)(char)bVar15 - 0x68U >> 1 | (uint)(((int)(char)bVar15 - 0x68U & 1) != 0) << 0x1f;
  if (uVar23 < 10) {
    pbVar19 = pbVar18 + -1;
    switch(uVar23) {
    case 0:
      if (pbVar18[-1] == 0x68) {
        pbVar19 = pbVar18;
      }
      in_AL = (pbVar18[-1] == 0x68) * '\x02' + 1;
      break;
    case 1:
      in_AL = 6;
      break;
    case 2:
      if (pbVar18[-1] == 0x6c) {
        pbVar19 = pbVar18;
      }
      in_AL = pbVar18[-1] == 0x6c | 4;
      break;
    default:
      goto switchD_00104e5f_caseD_3;
    case 6:
      in_AL = 8;
      break;
    case 9:
      in_AL = 7;
    }
  }
  else {
switchD_00104e5f_caseD_3:
    pbVar19 = pbVar18 + -2;
    in_AL = 0;
  }
  bVar1 = *pbVar19;
  iVar16 = 0;
  bVar15 = 0x20;
  if (bVar1 < 0x62) {
    if (bVar1 == 0x25) {
      local_7d = '\x01';
    }
    else {
      if (bVar1 == 0x42) {
        local_7d = '\x05';
      }
      else {
        if (bVar1 != 0x58) goto switchD_00104ed2_caseD_65;
        local_7d = '\a';
      }
      bVar15 = 0;
    }
    goto LAB_00104f3b;
  }
  iVar16 = 0;
  switch(bVar1) {
  case 0x62:
    local_7d = '\x05';
    break;
  case 99:
    local_7d = '\x02';
    break;
  case 100:
  case 0x69:
    local_7d = '\x04';
    break;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x71:
  case 0x72:
  case 0x74:
    goto switchD_00104ed2_caseD_65;
  case 0x6f:
    local_7d = '\x06';
    break;
  case 0x70:
    local_7d = '\t';
    break;
  case 0x73:
    local_7d = '\x03';
    break;
  case 0x75:
    local_7d = '\b';
    break;
  default:
    if (bVar1 == 0x78) {
      local_7d = '\a';
      break;
    }
    goto switchD_00104ed2_caseD_65;
  }
LAB_00104f3b:
  iVar16 = ((int)pbVar19 + 1) - (int)format;
switchD_00104ed2_caseD_65:
  if (iVar16 == 0) {
    format = (char *)((byte *)format + 1);
    iVar4 = iVar4 + 1;
    (*pc)((int)(char)bVar21,pc_ctx);
    goto LAB_00104ddf;
  }
  iVar17 = 0;
  switch(local_7d) {
  case '\x01':
    local_58[0] = CONCAT71(local_58[0]._1_7_,0x25);
    goto LAB_00105127;
  case '\x02':
    uVar23 = args->gp_offset;
    if ((ulong)uVar23 < 0x29) {
      puVar8 = (undefined1 *)((ulong)uVar23 + (long)args->reg_save_area);
      args->gp_offset = uVar23 + 8;
    }
    else {
      puVar8 = (undefined1 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar8 + 8;
    }
    local_58[0] = CONCAT71(local_58[0]._1_7_,*puVar8);
LAB_00105127:
    uVar20 = 1;
LAB_00105278:
    bVar21 = 0;
    puVar5 = local_58;
    break;
  case '\x03':
    uVar23 = args->gp_offset;
    if ((ulong)uVar23 < 0x29) {
      puVar6 = (undefined8 *)((ulong)uVar23 + (long)args->reg_save_area);
      args->gp_offset = uVar23 + 8;
    }
    else {
      puVar6 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar6 + 1;
    }
    puVar5 = (ulong *)*puVar6;
    if (puVar5 == (ulong *)0x0) {
      bVar21 = 0;
      uVar20 = 0;
    }
    else {
      uVar20 = 0;
      do {
        if (*(char *)((long)puVar5 + uVar20) == '\0') break;
        uVar20 = uVar20 + 1;
      } while (puVar5 != (ulong *)0x0);
      bVar21 = 0;
    }
    break;
  case '\x04':
    switch(in_AL) {
    case 0:
    case 2:
      uVar23 = args->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        piVar11 = (int *)((ulong)uVar23 + (long)args->reg_save_area);
        args->gp_offset = uVar23 + 8;
      }
      else {
        piVar11 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar11 + 2;
      }
      nVar14 = (npf_uint_t)*piVar11;
      break;
    case 1:
      uVar23 = args->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        psVar12 = (short *)((ulong)uVar23 + (long)args->reg_save_area);
        args->gp_offset = uVar23 + 8;
      }
      else {
        psVar12 = (short *)args->overflow_arg_area;
        args->overflow_arg_area = psVar12 + 4;
      }
      nVar14 = (npf_uint_t)*psVar12;
      break;
    case 3:
      uVar23 = args->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        pcVar13 = (char *)((ulong)uVar23 + (long)args->reg_save_area);
        args->gp_offset = uVar23 + 8;
      }
      else {
        pcVar13 = (char *)args->overflow_arg_area;
        args->overflow_arg_area = pcVar13 + 8;
      }
      nVar14 = (npf_uint_t)*pcVar13;
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      uVar23 = args->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        pnVar7 = (npf_uint_t *)((ulong)uVar23 + (long)args->reg_save_area);
        args->gp_offset = uVar23 + 8;
      }
      else {
        pnVar7 = (npf_uint_t *)args->overflow_arg_area;
        args->overflow_arg_area = pnVar7 + 1;
      }
      nVar14 = *pnVar7;
      break;
    default:
      nVar14 = 0;
    }
    bVar21 = unaff_R14B;
    if ((long)nVar14 < 0) {
      bVar21 = 0x2d;
    }
    val = -nVar14;
    if (0 < (long)nVar14) {
      val = nVar14;
    }
    puVar5 = local_58;
    uVar23 = npf_utoa_rev(val,(char *)puVar5,'\n',bVar15);
    uVar20 = (ulong)uVar23;
    break;
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
    switch(in_AL) {
    case 0:
    case 2:
      uVar23 = args->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        puVar9 = (uint *)((ulong)uVar23 + (long)args->reg_save_area);
        args->gp_offset = uVar23 + 8;
      }
      else {
        puVar9 = (uint *)args->overflow_arg_area;
        args->overflow_arg_area = puVar9 + 2;
      }
      uVar24 = (ulong)*puVar9;
      break;
    case 1:
      uVar23 = args->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        puVar10 = (ushort *)((ulong)uVar23 + (long)args->reg_save_area);
        args->gp_offset = uVar23 + 8;
      }
      else {
        puVar10 = (ushort *)args->overflow_arg_area;
        args->overflow_arg_area = puVar10 + 4;
      }
      uVar24 = (ulong)*puVar10;
      break;
    case 3:
      uVar23 = args->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        pbVar18 = (byte *)((ulong)uVar23 + (long)args->reg_save_area);
        args->gp_offset = uVar23 + 8;
      }
      else {
        pbVar18 = (byte *)args->overflow_arg_area;
        args->overflow_arg_area = pbVar18 + 8;
      }
      uVar24 = (ulong)*pbVar18;
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      uVar23 = args->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        puVar5 = (ulong *)((ulong)uVar23 + (long)args->reg_save_area);
        args->gp_offset = uVar23 + 8;
      }
      else {
        puVar5 = (ulong *)args->overflow_arg_area;
        args->overflow_arg_area = puVar5 + 1;
      }
      uVar24 = *puVar5;
      break;
    default:
      uVar24 = 0;
    }
    if (local_7d == '\x06') {
      base = '\b';
LAB_001051f9:
      uVar23 = npf_utoa_rev(uVar24,(char *)local_58,base,bVar15);
    }
    else {
      if (local_7d != '\x05') {
        base = '\n';
        if (local_7d == '\a') {
          base = '\x10';
        }
        goto LAB_001051f9;
      }
      lVar22 = 0x3f;
      if (uVar24 != 0) {
        for (; uVar24 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      uVar23 = ((uint)lVar22 ^ 0xffffffc0) + 0x41;
      if (uVar24 == 0) {
        uVar23 = 1;
      }
      local_58[0] = uVar24;
    }
    uVar20 = (ulong)uVar23;
    if (local_7d == '\x06' && (bVar3 != 0 && uVar24 != 0)) {
      uVar20 = (ulong)(uVar23 + 1);
      *(undefined1 *)((long)local_58 + (ulong)uVar23) = 0x30;
    }
    if (bVar3 != 0 && uVar24 != 0) {
      if (local_7d == '\a') {
        iVar17 = 0x58;
LAB_00105268:
        bVar2 = false;
      }
      else {
        if (local_7d == '\x05') {
          iVar17 = 0x42;
          goto LAB_00105268;
        }
        iVar17 = 0;
        bVar2 = true;
      }
      if (!bVar2) {
        iVar17 = iVar17 + (char)bVar15;
        bVar21 = 0;
        puVar5 = local_58;
        goto LAB_0010527f;
      }
    }
    goto LAB_00105278;
  case '\t':
    uVar23 = args->gp_offset;
    if ((ulong)uVar23 < 0x29) {
      pnVar7 = (npf_uint_t *)((ulong)uVar23 + (long)args->reg_save_area);
      args->gp_offset = uVar23 + 8;
    }
    else {
      pnVar7 = (npf_uint_t *)args->overflow_arg_area;
      args->overflow_arg_area = pnVar7 + 1;
    }
    puVar5 = local_58;
    uVar23 = npf_utoa_rev(*pnVar7,(char *)puVar5,'\x10',' ');
    uVar20 = (ulong)uVar23;
    iVar17 = 0x78;
    bVar21 = 0;
    goto LAB_0010527f;
  default:
    puVar5 = local_58;
    bVar21 = 0;
    uVar20 = 0;
    goto LAB_0010527f;
  }
  iVar17 = 0;
LAB_0010527f:
  if (iVar17 != 0) {
    local_38 = uVar20;
    (*pc)(0x30,pc_ctx);
    uVar20 = local_38;
    iVar4 = iVar4 + 2;
    (*pc)(iVar17,pc_ctx);
  }
  iVar17 = (int)uVar20;
  if (local_7d == '\x03') {
    if ((puVar5 != (ulong *)0x0) && (0 < iVar17)) {
      uVar24 = 0;
      do {
        (*pc)((int)*(char *)((long)puVar5 + uVar24),pc_ctx);
        uVar24 = uVar24 + 1;
        if (puVar5 == (ulong *)0x0) break;
      } while (uVar24 < (uVar20 & 0xffffffff));
      iVar4 = iVar4 + (int)uVar24;
    }
  }
  else {
    if (bVar21 != 0) {
      iVar4 = iVar4 + 1;
      (*pc)((int)(char)bVar21,pc_ctx);
    }
    if (local_7d == '\x05') {
      if (iVar17 != 0) {
        uVar20 = uVar20 & 0xffffffff;
        do {
          uVar20 = uVar20 - 1;
          (*pc)(SUB14((local_58[0] >> (uVar20 & 0x3f) & 1) != 0,0) + 0x30,pc_ctx);
        } while (uVar20 != 0);
        iVar4 = iVar17 + iVar4;
      }
    }
    else if (0 < iVar17) {
      lVar22 = (uVar20 & 0xffffffff) + 1;
      do {
        (*pc)((int)*(char *)((long)puVar5 + lVar22 + -2),pc_ctx);
        lVar22 = lVar22 + -1;
      } while (1 < lVar22);
      iVar4 = iVar17 + iVar4;
    }
  }
  format = (char *)((byte *)format + iVar16);
  args = local_40;
  goto LAB_00104ddf;
}

Assistant:

int npf_vpprintf(npf_putc pc, void *pc_ctx, char const *format, va_list args) {
  npf_format_spec_t fs;
  char const *cur = format;
  npf_cnt_putc_ctx_t pc_cnt;
  pc_cnt.pc = pc;
  pc_cnt.ctx = pc_ctx;
  pc_cnt.n = 0;

  while (*cur) {
    int const fs_len = (*cur != '%') ? 0 : npf_parse_format_spec(cur, &fs);
    if (!fs_len) { NPF_PUTC(*cur++); continue; }
    cur += fs_len;

    // Extract star-args immediately
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    if (fs.field_width_opt == NPF_FMT_SPEC_OPT_STAR) {
      fs.field_width = va_arg(args, int);
      if (fs.field_width < 0) {
        fs.field_width = -fs.field_width;
        fs.left_justified = 1;
      }
    }
#endif
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    if (fs.prec_opt == NPF_FMT_SPEC_OPT_STAR) {
      fs.prec = va_arg(args, int);
      if (fs.prec < 0) { fs.prec_opt = NPF_FMT_SPEC_OPT_NONE; }
    }
#endif

    union { char cbuf_mem[NANOPRINTF_CONVERSION_BUFFER_SIZE]; npf_uint_t binval; } u;
    char *cbuf = u.cbuf_mem, sign_c = 0;
    int cbuf_len = 0, need_0x = 0;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    int field_pad = 0;
    char pad_c = 0;
#endif
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    int prec_pad = 0;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    int zero = 0;
#endif
#endif

    // Extract and convert the argument to string, point cbuf at the text.
    switch (fs.conv_spec) {
      case NPF_FMT_SPEC_CONV_PERCENT:
        *cbuf = '%';
        cbuf_len = 1;
        break;

      case NPF_FMT_SPEC_CONV_CHAR:
        *cbuf = (char)va_arg(args, int);
        cbuf_len = 1;
        break;

      case NPF_FMT_SPEC_CONV_STRING: {
        cbuf = va_arg(args, char *);
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
        for (char const *s = cbuf;
             ((fs.prec_opt == NPF_FMT_SPEC_OPT_NONE) || (cbuf_len < fs.prec)) && cbuf && *s;
             ++s, ++cbuf_len);
#else
        for (char const *s = cbuf; cbuf && *s; ++s, ++cbuf_len); // strlen
#endif
      } break;

      case NPF_FMT_SPEC_CONV_SIGNED_INT: {
        npf_int_t val = 0;
        switch (fs.length_modifier) {
          NPF_EXTRACT(NONE, int, int);
          NPF_EXTRACT(SHORT, short, int);
          NPF_EXTRACT(LONG_DOUBLE, int, int);
          NPF_EXTRACT(CHAR, signed char, int);
          NPF_EXTRACT(LONG, long, long);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_EXTRACT(LARGE_LONG_LONG, long long, long long);
          NPF_EXTRACT(LARGE_INTMAX, intmax_t, intmax_t);
          NPF_EXTRACT(LARGE_SIZET, npf_ssize_t, npf_ssize_t);
          NPF_EXTRACT(LARGE_PTRDIFFT, ptrdiff_t, ptrdiff_t);
#endif
          default: break;
        }

        sign_c = (val < 0) ? '-' : fs.prepend;

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = !val;
#endif
        // special case, if prec and value are 0, skip
        if (!val && (fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec) {
          cbuf_len = 0;
        } else
#endif
        {
          npf_uint_t uval = (npf_uint_t)val;
          if (val < 0) { uval = 0 - uval; }
          cbuf_len = npf_utoa_rev(uval, cbuf, 10, fs.case_adjust);
        }
      } break;

#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_BINARY:
#endif
      case NPF_FMT_SPEC_CONV_OCTAL:
      case NPF_FMT_SPEC_CONV_HEX_INT:
      case NPF_FMT_SPEC_CONV_UNSIGNED_INT: {
        npf_uint_t val = 0;

        switch (fs.length_modifier) {
          NPF_EXTRACT(NONE, unsigned, unsigned);
          NPF_EXTRACT(SHORT, unsigned short, unsigned);
          NPF_EXTRACT(LONG_DOUBLE, unsigned, unsigned);
          NPF_EXTRACT(CHAR, unsigned char, unsigned);
          NPF_EXTRACT(LONG, unsigned long, unsigned long);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_EXTRACT(LARGE_LONG_LONG, unsigned long long, unsigned long long);
          NPF_EXTRACT(LARGE_INTMAX, uintmax_t, uintmax_t);
          NPF_EXTRACT(LARGE_SIZET, size_t, size_t);
          NPF_EXTRACT(LARGE_PTRDIFFT, size_t, size_t);
#endif
          default: break;
        }

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = !val;
#endif
        if (!val && (fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec) {
          // Zero value and explicitly-requested zero precision means "print nothing".
          if ((fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL) && fs.alt_form) {
            fs.prec = 1; // octal special case, print a single '0'
          }
        } else
#endif
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
        if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) {
          cbuf_len = npf_bin_len(val); u.binval = val;
        } else
#endif
        {
          uint_fast8_t const base = (fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL) ?
            8u : ((fs.conv_spec == NPF_FMT_SPEC_CONV_HEX_INT) ? 16u : 10u);
          cbuf_len = npf_utoa_rev(val, cbuf, base, fs.case_adjust);
        }

        if (val && fs.alt_form && (fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL)) {
          cbuf[cbuf_len++] = '0'; // OK to add leading octal '0' immediately.
        }

        if (val && fs.alt_form) { // 0x or 0b but can't write it yet.
          if (fs.conv_spec == NPF_FMT_SPEC_CONV_HEX_INT) { need_0x = 'X'; }
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
          else if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) { need_0x = 'B'; }
#endif
          if (need_0x) { need_0x += fs.case_adjust; }
        }
      } break;

      case NPF_FMT_SPEC_CONV_POINTER: {
        cbuf_len =
          npf_utoa_rev((npf_uint_t)(uintptr_t)va_arg(args, void *), cbuf, 16, 'a' - 'A');
        need_0x = 'x';
      } break;

#if NANOPRINTF_USE_WRITEBACK_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_WRITEBACK:
        switch (fs.length_modifier) {
          NPF_WRITEBACK(NONE, int);
          NPF_WRITEBACK(SHORT, short);
          NPF_WRITEBACK(LONG, long);
          NPF_WRITEBACK(LONG_DOUBLE, double);
          NPF_WRITEBACK(CHAR, signed char);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_WRITEBACK(LARGE_LONG_LONG, long long);
          NPF_WRITEBACK(LARGE_INTMAX, intmax_t);
          NPF_WRITEBACK(LARGE_SIZET, size_t);
          NPF_WRITEBACK(LARGE_PTRDIFFT, ptrdiff_t);
#endif
          default: break;
        } break;
#endif

#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_FLOAT_DEC:
      case NPF_FMT_SPEC_CONV_FLOAT_SCI:
      case NPF_FMT_SPEC_CONV_FLOAT_SHORTEST:
      case NPF_FMT_SPEC_CONV_FLOAT_HEX: {
        double val;
        if (fs.length_modifier == NPF_FMT_SPEC_LEN_MOD_LONG_DOUBLE) {
          val = (double)va_arg(args, long double);
        } else {
          val = va_arg(args, double);
        }

        sign_c = (val < 0.) ? '-' : fs.prepend;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = (val == 0.);
#endif
        cbuf_len = npf_ftoa_rev(cbuf, &fs, val);
      } break;
#endif
      default: break;
    }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    // Compute the field width pad character
    if (fs.field_width_opt != NPF_FMT_SPEC_OPT_NONE) {
      if (fs.leading_zero_pad) { // '0' flag is only legal with numeric types
        if ((fs.conv_spec != NPF_FMT_SPEC_CONV_STRING) &&
            (fs.conv_spec != NPF_FMT_SPEC_CONV_CHAR) &&
            (fs.conv_spec != NPF_FMT_SPEC_CONV_PERCENT)) {
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
          if ((fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec && zero) {
            pad_c = ' ';
          } else
#endif
          { pad_c = '0'; }
        }
      } else { pad_c = ' '; }
    }
#endif

    // Compute the number of bytes to truncate or '0'-pad.
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    if (fs.conv_spec != NPF_FMT_SPEC_CONV_STRING) {
#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
      // float precision is after the decimal point
      if ((fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_DEC) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_SCI) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_SHORTEST) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_HEX))
#endif
      { prec_pad = npf_max(0, fs.prec - cbuf_len); }
    }
#endif

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    // Given the full converted length, how many pad bytes?
    field_pad = fs.field_width - cbuf_len - !!sign_c;
    if (need_0x) { field_pad -= 2; }
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    field_pad -= prec_pad;
#endif
    field_pad = npf_max(0, field_pad);

    // Apply right-justified field width if requested
    if (!fs.left_justified && pad_c) { // If leading zeros pad, sign goes first.
      if (pad_c == '0') {
        if (sign_c) { NPF_PUTC(sign_c); sign_c = 0; }
        // Pad byte is '0', write '0x' before '0' pad chars.
        if (need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); }
      }
      while (field_pad-- > 0) { NPF_PUTC(pad_c); }
      // Pad byte is ' ', write '0x' after ' ' pad chars but before number.
      if ((pad_c != '0') && need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); }
    } else
#endif
    { if (need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); } } // no pad, '0x' requested.

    // Write the converted payload
    if (fs.conv_spec == NPF_FMT_SPEC_CONV_STRING) {
      for (int i = 0; cbuf && (i < cbuf_len); ++i) { NPF_PUTC(cbuf[i]); }
    } else {
      if (sign_c) { NPF_PUTC(sign_c); }
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      while (prec_pad-- > 0) { NPF_PUTC('0'); } // int precision leads.
#endif
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
      if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) {
        while (cbuf_len) { NPF_PUTC('0' + ((u.binval >> --cbuf_len) & 1)); }
      } else
#endif
      { while (cbuf_len-- > 0) { NPF_PUTC(cbuf[cbuf_len]); } } // payload is reversed
    }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    if (fs.left_justified && pad_c) { // Apply left-justified field width
      while (field_pad-- > 0) { NPF_PUTC(pad_c); }
    }
#endif
  }

  return pc_cnt.n;
}